

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::vector_s<Rect,_6UL>::vector_s(vector_s<Rect,_6UL> *this,initializer_list<Rect> *init)

{
  Rect *first;
  size_type sVar1;
  size_type sVar2;
  long lVar3;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  first = init->_M_array;
  sVar1 = init->_M_len;
  sVar2 = vector_s<Rect,6ul>::check_range<Rect_const*>
                    ((vector_s<Rect,6ul> *)this,first,first + sVar1);
  for (lVar3 = 0; sVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)((long)&this->data_ptr_->width_ + lVar3) =
         *(undefined8 *)((long)&first->width_ + lVar3);
  }
  this->size_ = sVar2;
  return;
}

Assistant:

vector_s(const std::initializer_list<T>& init)
    {
    //        std::cout << "vector_s(const std::initializer_list<T>& init) constructor this: " << this <<  std::endl;
        auto it = init.begin();
        const auto end = init.end();
        const auto diff = check_range(it, end);
        size_type i = 0u;
        for (; it != end; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it); // TODO: Is it OK to move here! Elements are already copied into initializer_list?
        }
        size_ = diff;
    }